

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.c
# Opt level: O0

int ndn_name_tlv_decode(ndn_decoder_t *decoder,ndn_name_t *name)

{
  int iVar1;
  int iVar2;
  int local_34;
  int result;
  int counter;
  uint32_t start_offset;
  uint32_t length;
  uint32_t type;
  int ret_val;
  ndn_name_t *name_local;
  ndn_decoder_t *decoder_local;
  
  length = 0xffffffff;
  start_offset = 0;
  _type = name;
  name_local = (ndn_name_t *)decoder;
  length = decoder_get_type(decoder,&start_offset);
  decoder_local._4_4_ = length;
  if (length == 0) {
    if (start_offset == 7) {
      counter = 0;
      decoder_local._4_4_ = decoder_get_length((ndn_decoder_t *)name_local,(uint32_t *)&counter);
      if (decoder_local._4_4_ == 0) {
        iVar1 = *(int *)(name_local->components[0].value + 8);
        local_34 = 0;
        length = 0;
        while (*(uint *)(name_local->components[0].value + 8) < (uint)(iVar1 + counter)) {
          if (9 < local_34) {
            return -10;
          }
          iVar2 = name_component_tlv_decode
                            ((ndn_decoder_t *)name_local,_type->components + local_34);
          if (iVar2 < 0) {
            return iVar2;
          }
          local_34 = local_34 + 1;
        }
        _type->components_size = (uint8_t)local_34;
        decoder_local._4_4_ = 0;
      }
    }
    else {
      decoder_local._4_4_ = 0xfffffff4;
    }
  }
  return decoder_local._4_4_;
}

Assistant:

int
ndn_name_tlv_decode(ndn_decoder_t* decoder, ndn_name_t* name)
{
  int ret_val = -1;
  uint32_t type = 0;
  ret_val = decoder_get_type(decoder, &type);
  if (ret_val != NDN_SUCCESS) return ret_val;
  if (type != TLV_Name) {
    return NDN_WRONG_TLV_TYPE;
  }
  uint32_t length = 0;
  ret_val = decoder_get_length(decoder, &length);
  if (ret_val != NDN_SUCCESS) return ret_val;
  uint32_t start_offset = decoder->offset;
  int counter = 0;
  while (decoder->offset < start_offset + length) {
    if (counter >= NDN_NAME_COMPONENTS_SIZE)
      return NDN_OVERSIZE;
    int result = name_component_tlv_decode(decoder, &name->components[counter]);
    if (result < 0)
      return result;
    ++counter;
  }
  name->components_size = counter;
  return 0;
}